

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O2

Bond_p __thiscall indigox::Molecule::GetBondIndex(Molecule *this,uid_t i)

{
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  iterator iVar2;
  uid_t uVar3;
  uid_t uVar4;
  uid_t in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  Bond_p BVar7;
  Bond_p b;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> local_50;
  uid_t local_40;
  uid_t local_38;
  
  (this->super_CountableObject<indigox::Molecule>).id_ = 0;
  (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
  super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  this_00 = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(i + 0xa8);
  local_40 = in_RDX;
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_00,&local_40);
  if (((iVar2.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
        ._M_cur != (__node_type *)0x0) &&
      (*(long *)((long)iVar2.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
                       ._M_cur + 0x18) != 0)) &&
     (*(int *)(*(long *)((long)iVar2.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
                               ._M_cur + 0x18) + 8) != 0)) {
    std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               (long)iVar2.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
                     ._M_cur + 0x10);
    uVar3 = Bond::GetIndex(local_50._M_ptr);
    uVar4 = local_40;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    if (uVar3 == uVar4) {
      std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 (long)iVar2.
                       super__Node_iterator_base<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_false>
                       ._M_cur + 0x10);
      std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)this,&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      _Var5._M_pi = extraout_RDX;
      goto LAB_00109fc7;
    }
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>,_std::allocator<std::pair<const_unsigned_long,_std::weak_ptr<indigox::Bond>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(this_00);
  p_Var1 = *(__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> **)(i + 0x60);
  _Var5._M_pi = extraout_RDX_00;
  for (p_Var6 = *(__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> **)(i + 0x58);
      p_Var6 != p_Var1; p_Var6 = p_Var6 + 1) {
    std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_50,p_Var6);
    uVar4 = Bond::GetIndex(local_50._M_ptr);
    if (uVar4 == local_40) {
      std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)this,&local_50);
    }
    local_38 = Bond::GetIndex(local_50._M_ptr);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_long,std::shared_ptr<indigox::Bond>&>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this_00,&local_38,&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    _Var5._M_pi = extraout_RDX_01;
  }
LAB_00109fc7:
  BVar7.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  BVar7.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Bond_p)BVar7.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p Molecule::GetBondIndex(uid_t i) {
  Bond_p bnd = Bond_p();
  auto it = idx_to_bond_.find(i);
  if (it != idx_to_bond_.end() && !(it->second.expired())
      && it->second.lock()->GetIndex() == i) {
    bnd = it->second.lock();
  } else {
    idx_to_bond_.clear();
    for (Bond_p b : bonds_) {
      if (b->GetIndex() == i) bnd = b;
      idx_to_bond_.emplace(b->GetIndex(), b);
    }
  }
  return bnd;
}